

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SerialAnalyzer.cpp
# Opt level: O2

void __thiscall SerialAnalyzer::WorkerThread(SerialAnalyzer *this)

{
  Mode MVar1;
  SerialAnalyzerSettings *pSVar2;
  SerialAnalyzerResults *pSVar3;
  bool bVar4;
  char cVar5;
  U32 UVar6;
  BitState BVar7;
  uint uVar8;
  int iVar9;
  AnalyzerChannelData *pAVar10;
  ulonglong uVar11;
  byte bVar12;
  ulong uVar13;
  U32 i_1;
  uint uVar14;
  MarkerType MVar15;
  U32 i;
  ulong uVar16;
  uint uVar17;
  ulonglong uVar18;
  ulong uVar19;
  bool bVar20;
  U64 data;
  FrameV2 frameV2;
  ulong local_a0;
  ulonglong local_68;
  undefined8 local_60;
  U64 local_58;
  byte local_47;
  DataBuilder data_builder;
  U8 bytes [8];
  
  UVar6 = Analyzer::GetSampleRate();
  this->mSampleRateHz = UVar6;
  ComputeSampleOffsets(this);
  pSVar2 = (this->mSettings)._M_t.
           super___uniq_ptr_impl<SerialAnalyzerSettings,_std::default_delete<SerialAnalyzerSettings>_>
           ._M_t.
           super__Tuple_impl<0UL,_SerialAnalyzerSettings_*,_std::default_delete<SerialAnalyzerSettings>_>
           .super__Head_base<0UL,_SerialAnalyzerSettings_*,_false>._M_head_impl;
  uVar14 = (pSVar2->mBitsPerTransfer + 1) - (uint)(pSVar2->mSerialMode == Normal);
  uVar17 = pSVar2->mBitsPerTransfer + 7 >> 3;
  bVar20 = pSVar2->mInverted;
  this->mBitHigh = bVar20 ^ BIT_HIGH;
  this->mBitLow = (uint)bVar20;
  uVar16 = 1;
  uVar19 = 0;
  uVar13 = (ulong)uVar14;
  while (iVar9 = (int)uVar13, uVar13 = (ulong)(iVar9 - 1), iVar9 != 0) {
    uVar19 = uVar19 | uVar16;
    uVar16 = uVar16 * 2;
  }
  pAVar10 = (AnalyzerChannelData *)Analyzer::GetAnalyzerChannelData((Channel *)this);
  this->mSerial = pAVar10;
  AnalyzerChannelData::TrackMinimumPulseWidth();
  BVar7 = AnalyzerChannelData::GetBitState();
  if (BVar7 == this->mBitLow) {
    AnalyzerChannelData::AdvanceToNextEdge();
  }
  do {
    AnalyzerChannelData::AdvanceToNextEdge();
    uVar11 = AnalyzerChannelData::GetSampleNumber();
    data = 0;
    DataBuilder::DataBuilder(&data_builder);
    DataBuilder::Reset((ulonglong *)&data_builder,(ShiftOrder)&data,
                       ((this->mSettings)._M_t.
                        super___uniq_ptr_impl<SerialAnalyzerSettings,_std::default_delete<SerialAnalyzerSettings>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_SerialAnalyzerSettings_*,_std::default_delete<SerialAnalyzerSettings>_>
                        .super__Head_base<0UL,_SerialAnalyzerSettings_*,_false>._M_head_impl)->
                       mShiftOrder);
    uVar18 = uVar11;
    for (uVar16 = 0; MVar15 = (MarkerType)uVar18, uVar14 != uVar16; uVar16 = uVar16 + 1) {
      AnalyzerChannelData::Advance((uint)this->mSerial);
      AnalyzerChannelData::GetBitState();
      DataBuilder::AddBit((BitState)&data_builder);
      uVar18 = uVar18 + (this->mSampleOffsets).
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start[uVar16];
      AnalyzerResults::AddMarker
                ((ulonglong)
                 (this->mResults)._M_t.
                 super___uniq_ptr_impl<SerialAnalyzerResults,_std::default_delete<SerialAnalyzerResults>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_SerialAnalyzerResults_*,_std::default_delete<SerialAnalyzerResults>_>
                 .super__Head_base<0UL,_SerialAnalyzerResults_*,_false>._M_head_impl,
                 (MarkerType)uVar18,(Channel *)0x0);
    }
    pSVar2 = (this->mSettings)._M_t.
             super___uniq_ptr_impl<SerialAnalyzerSettings,_std::default_delete<SerialAnalyzerSettings>_>
             ._M_t.
             super__Tuple_impl<0UL,_SerialAnalyzerSettings_*,_std::default_delete<SerialAnalyzerSettings>_>
             .super__Head_base<0UL,_SerialAnalyzerSettings_*,_false>._M_head_impl;
    if (pSVar2->mInverted != false) {
      data = ~data & uVar19;
    }
    MVar1 = pSVar2->mSerialMode;
    if (MVar1 == Normal) {
      local_a0 = 0;
    }
    else {
      local_a0 = data >> ((char)uVar14 - 1U & 0x3f);
      if (MVar1 == MpModeMsbZeroMeansAddress) {
        local_a0 = local_a0 ^ 1;
      }
      else if (MVar1 != MpModeMsbOneMeansAddress) {
        local_a0 = 0;
      }
      data = data & uVar19 >> 1;
    }
    if (pSVar2->mParity == None) {
      bVar20 = false;
    }
    else {
      AnalyzerChannelData::Advance((uint)this->mSerial);
      uVar8 = AnalyzerHelpers::GetOnesCount(data);
      cVar5 = AnalyzerHelpers::IsEven((ulong)uVar8);
      if (((this->mSettings)._M_t.
           super___uniq_ptr_impl<SerialAnalyzerSettings,_std::default_delete<SerialAnalyzerSettings>_>
           ._M_t.
           super__Tuple_impl<0UL,_SerialAnalyzerSettings_*,_std::default_delete<SerialAnalyzerSettings>_>
           .super__Head_base<0UL,_SerialAnalyzerSettings_*,_false>._M_head_impl)->mParity == Even) {
        if (cVar5 != '\0') {
          BVar7 = AnalyzerChannelData::GetBitState();
          goto LAB_00106096;
        }
        BVar7 = AnalyzerChannelData::GetBitState();
LAB_00106089:
        bVar20 = BVar7 == this->mBitHigh;
      }
      else {
        if (cVar5 != '\0') {
          BVar7 = AnalyzerChannelData::GetBitState();
          goto LAB_00106089;
        }
        BVar7 = AnalyzerChannelData::GetBitState();
LAB_00106096:
        bVar20 = BVar7 == this->mBitLow;
      }
      bVar20 = !bVar20;
      MVar15 = MVar15 + this->mParityBitOffset;
      AnalyzerResults::AddMarker
                ((ulonglong)
                 (this->mResults)._M_t.
                 super___uniq_ptr_impl<SerialAnalyzerResults,_std::default_delete<SerialAnalyzerResults>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_SerialAnalyzerResults_*,_std::default_delete<SerialAnalyzerResults>_>
                 .super__Head_base<0UL,_SerialAnalyzerResults_*,_false>._M_head_impl,MVar15,
                 (Channel *)0x2);
    }
    AnalyzerChannelData::Advance((uint)this->mSerial);
    BVar7 = AnalyzerChannelData::GetBitState();
    if ((BVar7 == this->mBitHigh) &&
       (iVar9 = AnalyzerChannelData::Advance((uint)this->mSerial), iVar9 == 0)) {
      bVar4 = false;
    }
    else {
      MVar15 = MVar15 + this->mStartOfStopBitOffset;
      AnalyzerResults::AddMarker
                ((ulonglong)
                 (this->mResults)._M_t.
                 super___uniq_ptr_impl<SerialAnalyzerResults,_std::default_delete<SerialAnalyzerResults>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_SerialAnalyzerResults_*,_std::default_delete<SerialAnalyzerResults>_>
                 .super__Head_base<0UL,_SerialAnalyzerResults_*,_false>._M_head_impl,MVar15,
                 (Channel *)0x7);
      bVar4 = true;
      if (this->mEndOfStopBitOffset != 0) {
        AnalyzerResults::AddMarker
                  ((ulonglong)
                   (this->mResults)._M_t.
                   super___uniq_ptr_impl<SerialAnalyzerResults,_std::default_delete<SerialAnalyzerResults>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_SerialAnalyzerResults_*,_std::default_delete<SerialAnalyzerResults>_>
                   .super__Head_base<0UL,_SerialAnalyzerResults_*,_false>._M_head_impl,
                   MVar15 + this->mEndOfStopBitOffset,(Channel *)0x7);
      }
    }
    Frame::Frame((Frame *)&local_68);
    local_68 = uVar11;
    local_60 = AnalyzerChannelData::GetSampleNumber();
    local_58 = data;
    bVar12 = 0;
    if (bVar20) {
      bVar12 = 0x82;
    }
    local_47 = bVar12 | 0x81;
    if (!bVar4) {
      local_47 = bVar12;
    }
    if ((local_a0 & 1) != 0) {
      local_47 = local_47 | 4;
      AnalyzerResults::CommitPacketAndStartNewPacket();
    }
    AnalyzerResults::AddFrame
              ((Frame *)(this->mResults)._M_t.
                        super___uniq_ptr_impl<SerialAnalyzerResults,_std::default_delete<SerialAnalyzerResults>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_SerialAnalyzerResults_*,_std::default_delete<SerialAnalyzerResults>_>
                        .super__Head_base<0UL,_SerialAnalyzerResults_*,_false>._M_head_impl);
    FrameV2::FrameV2(&frameV2);
    iVar9 = uVar17 * 8;
    for (uVar16 = 0; iVar9 = iVar9 + -8, uVar17 != uVar16; uVar16 = uVar16 + 1) {
      bytes[uVar16] = (U8)(data >> ((byte)iVar9 & 0x3f));
    }
    FrameV2::AddByteArray((char *)&frameV2,(uchar *)"data",(ulonglong)bytes);
    if (bVar20 || bVar4) {
      FrameV2::AddString((char *)&frameV2,"error");
    }
    if (((this->mSettings)._M_t.
         super___uniq_ptr_impl<SerialAnalyzerSettings,_std::default_delete<SerialAnalyzerSettings>_>
         ._M_t.
         super__Tuple_impl<0UL,_SerialAnalyzerSettings_*,_std::default_delete<SerialAnalyzerSettings>_>
         .super__Head_base<0UL,_SerialAnalyzerSettings_*,_false>._M_head_impl)->mSerialMode !=
        Normal) {
      FrameV2::AddBoolean((char *)&frameV2,true);
    }
    pSVar3 = (this->mResults)._M_t.
             super___uniq_ptr_impl<SerialAnalyzerResults,_std::default_delete<SerialAnalyzerResults>_>
             ._M_t.
             super__Tuple_impl<0UL,_SerialAnalyzerResults_*,_std::default_delete<SerialAnalyzerResults>_>
             .super__Head_base<0UL,_SerialAnalyzerResults_*,_false>._M_head_impl;
    AnalyzerChannelData::GetSampleNumber();
    AnalyzerResults::AddFrameV2((FrameV2 *)pSVar3,(char *)&frameV2,0x109040,uVar11);
    AnalyzerResults::CommitResults();
    Analyzer::ReportProgress((ulonglong)this);
    Analyzer::CheckIfThreadShouldExit();
    if ((bVar4) && (BVar7 = AnalyzerChannelData::GetBitState(), BVar7 == this->mBitLow)) {
      AnalyzerChannelData::AdvanceToNextEdge();
    }
    FrameV2::~FrameV2(&frameV2);
    Frame::~Frame((Frame *)&local_68);
    DataBuilder::~DataBuilder(&data_builder);
  } while( true );
}

Assistant:

void SerialAnalyzer::WorkerThread()
{
    mSampleRateHz = GetSampleRate();
    ComputeSampleOffsets();

    U32 bits_per_transfer = mSettings->mBitsPerTransfer;
    if( mSettings->mSerialMode != SerialAnalyzerEnums::Normal )
        bits_per_transfer++;

    // used for HLA byte count, this should not include an extra bit for MP/MDB
    const U32 bytes_per_transfer = ( mSettings->mBitsPerTransfer + 7 ) / 8;

    if( mSettings->mInverted == false )
    {
        mBitHigh = BIT_HIGH;
        mBitLow = BIT_LOW;
    }
    else
    {
        mBitHigh = BIT_LOW;
        mBitLow = BIT_HIGH;
    }

    U64 bit_mask = 0;
    U64 mask = 0x1ULL;
    for( U32 i = 0; i < bits_per_transfer; i++ )
    {
        bit_mask |= mask;
        mask <<= 1;
    }

    mSerial = GetAnalyzerChannelData( mSettings->mInputChannel );
    mSerial->TrackMinimumPulseWidth();

    if( mSerial->GetBitState() == mBitLow )
        mSerial->AdvanceToNextEdge();

    for( ;; )
    {
        // we're starting high. (we'll assume that we're not in the middle of a byte.)

        mSerial->AdvanceToNextEdge();

        // we're now at the beginning of the start bit.  We can start collecting the data.
        U64 frame_starting_sample = mSerial->GetSampleNumber();

        U64 data = 0;
        bool parity_error = false;
        bool framing_error = false;
        bool mp_is_address = false;

        DataBuilder data_builder;
        data_builder.Reset( &data, mSettings->mShiftOrder, bits_per_transfer );
        U64 marker_location = frame_starting_sample;

        for( U32 i = 0; i < bits_per_transfer; i++ )
        {
            mSerial->Advance( mSampleOffsets[ i ] );
            data_builder.AddBit( mSerial->GetBitState() );

            marker_location += mSampleOffsets[ i ];
            mResults->AddMarker( marker_location, AnalyzerResults::Dot, mSettings->mInputChannel );
        }

        if( mSettings->mInverted == true )
            data = ( ~data ) & bit_mask;

        if( mSettings->mSerialMode != SerialAnalyzerEnums::Normal )
        {
            // extract the MSB
            U64 msb = data >> ( bits_per_transfer - 1 );
            msb &= 0x1;
            if( mSettings->mSerialMode == SerialAnalyzerEnums::MpModeMsbOneMeansAddress )
            {
                mp_is_address = msb == 0x1;
            }
            else if( mSettings->mSerialMode == SerialAnalyzerEnums::MpModeMsbZeroMeansAddress )
            {
                mp_is_address = msb == 0x0;
            }
            // now remove the msb.
            data &= ( bit_mask >> 1 );
        }

        parity_error = false;

        if( mSettings->mParity != AnalyzerEnums::None )
        {
            mSerial->Advance( mParityBitOffset );
            bool is_even = AnalyzerHelpers::IsEven( AnalyzerHelpers::GetOnesCount( data ) );

            if( mSettings->mParity == AnalyzerEnums::Even )
            {
                if( is_even == true )
                {
                    if( mSerial->GetBitState() != mBitLow ) // we expect a low bit, to keep the parity even.
                        parity_error = true;
                }
                else
                {
                    if( mSerial->GetBitState() != mBitHigh ) // we expect a high bit, to force parity even.
                        parity_error = true;
                }
            }
            else // if( mSettings->mParity == AnalyzerEnums::Odd )
            {
                if( is_even == false )
                {
                    if( mSerial->GetBitState() != mBitLow ) // we expect a low bit, to keep the parity odd.
                        parity_error = true;
                }
                else
                {
                    if( mSerial->GetBitState() != mBitHigh ) // we expect a high bit, to force parity odd.
                        parity_error = true;
                }
            }

            marker_location += mParityBitOffset;
            mResults->AddMarker( marker_location, AnalyzerResults::Square, mSettings->mInputChannel );
        }

        // now we must determine if there is a framing error.
        framing_error = false;

        mSerial->Advance( mStartOfStopBitOffset );

        if( mSerial->GetBitState() != mBitHigh )
        {
            framing_error = true;
        }
        else
        {
            U32 num_edges = mSerial->Advance( mEndOfStopBitOffset );
            if( num_edges != 0 )
                framing_error = true;
        }

        if( framing_error == true )
        {
            marker_location += mStartOfStopBitOffset;
            mResults->AddMarker( marker_location, AnalyzerResults::ErrorX, mSettings->mInputChannel );

            if( mEndOfStopBitOffset != 0 )
            {
                marker_location += mEndOfStopBitOffset;
                mResults->AddMarker( marker_location, AnalyzerResults::ErrorX, mSettings->mInputChannel );
            }
        }

        // ok now record the value!
        // note that we're not using the mData2 or mType fields for anything, so we won't bother to set them.
        Frame frame;
        frame.mStartingSampleInclusive = static_cast<S64>( frame_starting_sample );
        frame.mEndingSampleInclusive = static_cast<S64>( mSerial->GetSampleNumber() );
        frame.mData1 = data;
        frame.mFlags = 0;
        if( parity_error == true )
            frame.mFlags |= PARITY_ERROR_FLAG | DISPLAY_AS_ERROR_FLAG;

        if( framing_error == true )
            frame.mFlags |= FRAMING_ERROR_FLAG | DISPLAY_AS_ERROR_FLAG;

        if( mp_is_address == true )
            frame.mFlags |= MP_MODE_ADDRESS_FLAG;

        if( mp_is_address == true )
            mResults->CommitPacketAndStartNewPacket();

        mResults->AddFrame( frame );

        FrameV2 frameV2;

        U8 bytes[ 8 ];
        for( U32 i = 0; i < bytes_per_transfer; ++i )
        {
            auto bit_offset = ( bytes_per_transfer - i - 1 ) * 8;
            bytes[ i ] = static_cast<U8>( data >> bit_offset );
        }
        frameV2.AddByteArray( "data", bytes, bytes_per_transfer );

        if( parity_error )
        {
            frameV2.AddString( "error", "parity" );
        }
        else if( framing_error )
        {
            frameV2.AddString( "error", "framing" );
        }

        if( mSettings->mSerialMode != SerialAnalyzerEnums::Normal )
        {
            frameV2.AddBoolean( "address", mp_is_address );
        }

        mResults->AddFrameV2( frameV2, "data", frame_starting_sample, mSerial->GetSampleNumber() );

        mResults->CommitResults();

        ReportProgress( frame.mEndingSampleInclusive );
        CheckIfThreadShouldExit();

        if( framing_error == true ) // if we're still low, let's fix that for the next round.
        {
            if( mSerial->GetBitState() == mBitLow )
                mSerial->AdvanceToNextEdge();
        }
    }
}